

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O2

void __thiscall
ValidationSignals::UpdatedBlockTip
          (ValidationSignals *this,CBlockIndex *pindexNew,CBlockIndex *pindexFork,
          bool fInitialDownload)

{
  unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_> uVar1;
  bool bVar2;
  char *pcVar3;
  code cVar4;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  allocator<char> local_c9;
  char *local_name;
  bool fInitialDownload_local;
  base_blob<256u> local_b8 [32];
  string local_98;
  base_blob<256u> local_78 [32];
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_name = "UpdatedBlockTip";
  fInitialDownload_local = fInitialDownload;
  bVar2 = ::LogAcceptCategory((LogFlags)this,(Level)pindexNew);
  pcVar3 = "UpdatedBlockTip";
  cVar4 = (code)fInitialDownload;
  if (bVar2) {
    CBlockIndex::GetBlockHash((uint256 *)local_78,pindexNew);
    base_blob<256u>::ToString_abi_cxx11_(&local_58,local_78);
    if (pindexFork == (CBlockIndex *)0x0) {
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x38eb80;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"null",&local_c9);
    }
    else {
      CBlockIndex::GetBlockHash((uint256 *)local_b8,pindexFork);
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x38eb68;
      base_blob<256u>::ToString_abi_cxx11_(&local_98,local_b8);
    }
    logging_function._M_str = "UpdatedBlockTip";
    logging_function._M_len = 0xf;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validationinterface.cpp"
    ;
    source_file._M_len = 0x60;
    LogPrintf_<char_const*,std::__cxx11::string,std::__cxx11::string,bool>
              (logging_function,source_file,0x6dd63f,(LogFlags)&local_name,(Level)&local_58,
               (char *)&local_98,(char **)&fInitialDownload_local,args_1,in_stack_fffffffffffffef8,
               (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_58);
    pcVar3 = local_name;
    cVar4 = (code)fInitialDownload_local;
  }
  uVar1._M_t.
  super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>.
  _M_t.
  super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
  .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl =
       (((this->m_internals)._M_t.
         super___uniq_ptr_impl<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>.
         _M_t.
         super__Tuple_impl<0UL,_ValidationSignalsImpl_*,_std::default_delete<ValidationSignalsImpl>_>
         .super__Head_base<0UL,_ValidationSignalsImpl_*,_false>._M_head_impl)->m_task_runner)._M_t;
  local_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_f8._M_unused._M_object = operator_new(0x40);
  *(char **)local_f8._M_unused._0_8_ = pcVar3;
  *(CBlockIndex **)((long)local_f8._M_unused._0_8_ + 8) = pindexNew;
  *(CBlockIndex **)((long)local_f8._M_unused._0_8_ + 0x10) = pindexFork;
  *(code *)((long)local_f8._M_unused._0_8_ + 0x18) = cVar4;
  *(CBlockIndex **)((long)local_f8._M_unused._0_8_ + 0x20) = pindexNew;
  *(CBlockIndex **)((long)local_f8._M_unused._0_8_ + 0x28) = pindexFork;
  *(bool *)((long)local_f8._M_unused._0_8_ + 0x30) = fInitialDownload;
  *(ValidationSignals **)((long)local_f8._M_unused._0_8_ + 0x38) = this;
  pcStack_e0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validationinterface.cpp:180:5)>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validationinterface.cpp:180:5)>
             ::_M_manager;
  (**(code **)(*(long *)uVar1._M_t.
                        super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                        .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl +
              0x10))(uVar1._M_t.
                     super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                     .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::UpdatedBlockTip(const CBlockIndex *pindexNew, const CBlockIndex *pindexFork, bool fInitialDownload) {
    // Dependencies exist that require UpdatedBlockTip events to be delivered in the order in which
    // the chain actually updates. One way to ensure this is for the caller to invoke this signal
    // in the same critical section where the chain is updated

    auto event = [pindexNew, pindexFork, fInitialDownload, this] {
        m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.UpdatedBlockTip(pindexNew, pindexFork, fInitialDownload); });
    };
    ENQUEUE_AND_LOG_EVENT(event, "%s: new block hash=%s fork block hash=%s (in IBD=%s)", __func__,
                          pindexNew->GetBlockHash().ToString(),
                          pindexFork ? pindexFork->GetBlockHash().ToString() : "null",
                          fInitialDownload);
}